

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O3

int Llb_ManGroupHasVar(Llb_Man_t *p,int iGroup,int iVar)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if ((-1 < iGroup) && (iGroup < p->vGroups->nSize)) {
    pvVar1 = p->vGroups->pArray[(uint)iGroup];
    lVar2 = *(long *)((long)pvVar1 + 8);
    lVar3 = (long)*(int *)(lVar2 + 4);
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        if (*(int *)(*(long *)(*(long *)(lVar2 + 8) + lVar4 * 8) + 0x24) == iVar) {
          return 1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    lVar2 = *(long *)((long)pvVar1 + 0x10);
    lVar3 = (long)*(int *)(lVar2 + 4);
    if (0 < lVar3) {
      lVar4 = 0;
      do {
        if (*(int *)(*(long *)(*(long *)(lVar2 + 8) + lVar4 * 8) + 0x24) == iVar) {
          return 1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar3 != lVar4);
    }
    return 0;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Llb_ManGroupHasVar( Llb_Man_t * p, int iGroup, int iVar )
{
    Llb_Grp_t * pGroup = (Llb_Grp_t *)Vec_PtrEntry( p->vGroups, iGroup );
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
        if ( pObj->Id == iVar )
            return 1;
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
        if ( pObj->Id == iVar )
            return 1;
    return 0;
}